

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O2

void __thiscall FSAOHDist_NECOF::~FSAOHDist_NECOF(FSAOHDist_NECOF *this)

{
  pointer ppuVar1;
  long lVar2;
  reference ppCVar3;
  ulong uVar4;
  uint uVar5;
  
  (this->super_FactoredStateAOHDistribution)._vptr_FactoredStateAOHDistribution =
       (_func_int **)&PTR__FSAOHDist_NECOF_00604008;
  lVar2 = (long)(this->_m_oHistConditional).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_m_oHistConditional).
                super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
  uVar4 = lVar2 >> 3;
  if ((long)(this->_m_stepsize).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->_m_stepsize).
            super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
            super__Vector_impl_data._M_start == lVar2) {
    uVar5 = 0;
    while( true ) {
      ppuVar1 = (this->_m_stepsize).
                super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (uVar4 <= uVar5) break;
      if (ppuVar1[uVar5] != (unsigned_long *)0x0) {
        operator_delete__(ppuVar1[uVar5]);
      }
      uVar5 = uVar5 + 1;
    }
    if ((this->_m_stepsize).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppuVar1) {
      (this->_m_stepsize).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppuVar1;
    }
  }
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    ppCVar3 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::at
                        (&this->_m_oHistConditional,(ulong)uVar5);
    if (*ppCVar3 != (value_type)0x0) {
      (*(*ppCVar3)->_vptr_CPDDiscreteInterface[1])();
    }
  }
  if (this->_m_sfacMarginals != (FSDist_COF *)0x0) {
    (*(this->_m_sfacMarginals->super_FactoredStateDistribution).super_StateDistribution.
      _vptr_StateDistribution[1])();
  }
  std::_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~_Vector_base
            (&(this->_m_stepsize).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->_m_sfacSoI_ii_size).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<Scope,_std::allocator<Scope>_>::~vector(&this->_m_sfacSoI);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->_m_oHistMarginals);
  std::_Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~_Vector_base
            (&(this->_m_oHistConditional).
              super__Vector_base<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>);
  return;
}

Assistant:

FSAOHDist_NECOF::~FSAOHDist_NECOF()
{
    size_t nrAg = _m_oHistConditional.size();
    if(_m_stepsize.size()== nrAg)
    {
        for( Index agI=0; agI < nrAg; agI++)    
        {
            size_t * sz_arr = _m_stepsize[agI];
            if( sz_arr != 0)
                delete [] sz_arr;
        }
        _m_stepsize.clear();
    }

    for(Index agI=0; agI < nrAg; agI++)
        delete _m_oHistConditional.at(agI);

    delete _m_sfacMarginals;
}